

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v9::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> bStack_d8;
  
  uVar10 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar2 = (uint)uVar10;
  uVar3 = (ulong)(uVar2 * 2);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&bStack_d8,&this->bigits_);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar3) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar3);
  }
  uVar4 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar3 <= uVar4) {
    uVar4 = uVar3;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar4;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar9 = 0;
    uVar3 = 0;
    uVar4 = 0;
    puVar7 = bStack_d8.super_buffer<unsigned_int>.ptr_;
    uVar5 = uVar9;
    do {
      do {
        bVar12 = CARRY8(uVar3,(ulong)bStack_d8.super_buffer<unsigned_int>.ptr_[uVar9] *
                              (ulong)*puVar7);
        uVar3 = uVar3 + (ulong)bStack_d8.super_buffer<unsigned_int>.ptr_[uVar9] * (ulong)*puVar7;
        uVar4 = uVar4 + bVar12;
        bVar12 = uVar9 != 0;
        uVar9 = uVar9 - 1;
        puVar7 = puVar7 + 1;
      } while (bVar12);
      puVar1[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar9 = uVar5 + 1;
      puVar7 = bStack_d8.super_buffer<unsigned_int>.ptr_;
      uVar5 = uVar9;
    } while (uVar9 != (uVar2 & 0x7fffffff));
  }
  if ((int)uVar2 < (int)(uVar2 * 2)) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    iVar6 = -uVar2;
    uVar10 = uVar10 & 0xffffffff;
    uVar8 = 1;
    do {
      if ((int)((int)uVar10 - (uVar2 - 1)) < (int)uVar2) {
        puVar7 = bStack_d8.super_buffer<unsigned_int>.ptr_ + (int)uVar8;
        lVar11 = -1;
        do {
          bVar12 = CARRY8(uVar3,(ulong)bStack_d8.super_buffer<unsigned_int>.ptr_
                                       [(int)uVar2 + lVar11] * (ulong)*puVar7);
          uVar3 = uVar3 + (ulong)bStack_d8.super_buffer<unsigned_int>.ptr_[(int)uVar2 + lVar11] *
                          (ulong)*puVar7;
          uVar4 = uVar4 + bVar12;
          lVar11 = lVar11 + -1;
          puVar7 = puVar7 + 1;
        } while (iVar6 != (int)lVar11);
      }
      puVar1[uVar10] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar10 = (ulong)((int)uVar10 + 1);
      iVar6 = iVar6 + 1;
      bVar12 = uVar8 != uVar2;
      uVar8 = uVar8 + 1;
    } while (bVar12);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (bStack_d8.super_buffer<unsigned_int>.ptr_ != bStack_d8.store_) {
    operator_delete(bStack_d8.super_buffer<unsigned_int>.ptr_,
                    bStack_d8.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }